

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O1

uint32_t FAPOBase_GetRegistrationProperties
                   (FAPOBase *fapo,FAPORegistrationProperties **ppRegistrationProperties)

{
  FAPORegistrationProperties *pFVar1;
  
  pFVar1 = (FAPORegistrationProperties *)(*fapo->pMalloc)(0x42c);
  *ppRegistrationProperties = pFVar1;
  SDL_memcpy(pFVar1,fapo->m_pRegistrationProperties,0x42c);
  return 0;
}

Assistant:

uint32_t FAPOBase_GetRegistrationProperties(
	FAPOBase *fapo,
	FAPORegistrationProperties **ppRegistrationProperties
) {
	*ppRegistrationProperties = (FAPORegistrationProperties*) fapo->pMalloc(
		sizeof(FAPORegistrationProperties)
	);
	FAudio_memcpy(
		*ppRegistrationProperties,
		fapo->m_pRegistrationProperties,
		sizeof(FAPORegistrationProperties)
	);
	return 0;
}